

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

uint serialize(Scanner *scanner,char *buffer)

{
  Heredoc *pHVar1;
  Heredoc *heredoc;
  uint32_t i;
  uint32_t size;
  char *buffer_local;
  Scanner *scanner_local;
  
  *buffer = scanner->last_glob_paren_depth;
  buffer[1] = scanner->ext_was_in_double_quote & 1;
  buffer[2] = scanner->ext_saw_outside_quote & 1;
  heredoc._4_4_ = 4;
  buffer[3] = (char)(scanner->heredocs).size;
  heredoc._0_4_ = 0;
  while( true ) {
    if ((scanner->heredocs).size <= (uint)heredoc) {
      return heredoc._4_4_;
    }
    if ((scanner->heredocs).size <= (uint)heredoc) break;
    pHVar1 = (scanner->heredocs).contents + (uint)heredoc;
    if (0x3ff < (pHVar1->delimiter).size + 3 + heredoc._4_4_) {
      return 0;
    }
    buffer[heredoc._4_4_] = pHVar1->is_raw & 1;
    buffer[heredoc._4_4_ + 1] = pHVar1->started & 1;
    buffer[heredoc._4_4_ + 2] = pHVar1->allows_indent & 1;
    *(uint32_t *)(buffer + (heredoc._4_4_ + 3)) = (pHVar1->delimiter).size;
    heredoc._4_4_ = heredoc._4_4_ + 7;
    if ((pHVar1->delimiter).size != 0) {
      memcpy(buffer + heredoc._4_4_,(pHVar1->delimiter).contents,(ulong)(pHVar1->delimiter).size);
      heredoc._4_4_ = (pHVar1->delimiter).size + heredoc._4_4_;
    }
    heredoc._0_4_ = (uint)heredoc + 1;
  }
  __assert_fail("(uint32_t)(i) < (&scanner->heredocs)->size",
                "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-bash/src/scanner.c"
                ,0x66,"unsigned int serialize(Scanner *, char *)");
}

Assistant:

static unsigned serialize(Scanner *scanner, char *buffer) {
    uint32_t size = 0;

    buffer[size++] = (char)scanner->last_glob_paren_depth;
    buffer[size++] = (char)scanner->ext_was_in_double_quote;
    buffer[size++] = (char)scanner->ext_saw_outside_quote;
    buffer[size++] = (char)scanner->heredocs.size;

    for (uint32_t i = 0; i < scanner->heredocs.size; i++) {
        Heredoc *heredoc = array_get(&scanner->heredocs, i);
        if (heredoc->delimiter.size + 3 + size >= TREE_SITTER_SERIALIZATION_BUFFER_SIZE) {
            return 0;
        }

        buffer[size++] = (char)heredoc->is_raw;
        buffer[size++] = (char)heredoc->started;
        buffer[size++] = (char)heredoc->allows_indent;

        memcpy(&buffer[size], &heredoc->delimiter.size, sizeof(uint32_t));
        size += sizeof(uint32_t);
        if (heredoc->delimiter.size > 0) {
            memcpy(&buffer[size], heredoc->delimiter.contents, heredoc->delimiter.size);
            size += heredoc->delimiter.size;
        }
    }
    return size;
}